

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O1

void __thiscall QTreeModel::timerEvent(QTreeModel *this,QTimerEvent *ev)

{
  TimerId TVar1;
  int iVar2;
  SortOrder SVar3;
  QTreeView *pQVar4;
  QHeaderView *pQVar5;
  
  TVar1 = (this->sortPendingTimer).m_id;
  if (*(TimerId *)(ev + 0x10) != TVar1) {
    QObject::timerEvent((QTimerEvent *)this);
    return;
  }
  if (((TVar1 != Invalid) && (this->skipPendingSort == false)) &&
     (*(long *)(*(long *)&this->field_0x8 + 0x88) == 0)) {
    QBasicTimer::stop();
    pQVar4 = (QTreeView *)QMetaObject::cast((QObject *)&QTreeWidget::staticMetaObject);
    pQVar5 = QTreeView::header(pQVar4);
    iVar2 = QHeaderView::sortIndicatorSection(pQVar5);
    pQVar4 = (QTreeView *)QMetaObject::cast((QObject *)&QTreeWidget::staticMetaObject);
    pQVar5 = QTreeView::header(pQVar4);
    SVar3 = QHeaderView::sortIndicatorOrder(pQVar5);
    (**(code **)(*(long *)this + 0x140))(this,iVar2,SVar3,*(code **)(*(long *)this + 0x140));
    return;
  }
  return;
}

Assistant:

void QTreeModel::timerEvent(QTimerEvent *ev)
{
    if (ev->timerId() == sortPendingTimer.timerId()) {
        executePendingSort();
    } else {
        QAbstractItemModel::timerEvent(ev);
    }
}